

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O3

void LEARNER::generic_driver(vector<vw_*,_std::allocator<vw_*>_> *alls)

{
  vw *all;
  pointer ppvVar1;
  base_learner *pbVar2;
  vector<vw_*,_std::allocator<vw_*>_> local_30;
  
  all = *(alls->super__Vector_base<vw_*,_std::allocator<vw_*>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  std::vector<vw_*,_std::allocator<vw_*>_>::vector(&local_30,alls);
  generic_driver<std::vector<vw_*,_std::allocator<vw_*>_>,_&LEARNER::process_multiple>
            (all,&local_30);
  if (local_30.super__Vector_base<vw_*,_std::allocator<vw_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<vw_*,_std::allocator<vw_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ppvVar1 = (alls->super__Vector_base<vw_*,_std::allocator<vw_*>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  while (ppvVar1 = ppvVar1 + 1,
        ppvVar1 !=
        (alls->super__Vector_base<vw_*,_std::allocator<vw_*>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
    pbVar2 = (*ppvVar1)->l;
    do {
      (**(code **)(pbVar2 + 0xb0))(*(undefined8 *)(pbVar2 + 0xa0));
      pbVar2 = *(base_learner **)(pbVar2 + 0xa8);
    } while (pbVar2 != (base_learner *)0x0);
  }
  return;
}

Assistant:

void generic_driver(vector<vw*> alls)
{
  generic_driver<vector<vw*>, process_multiple>(**alls.begin(), alls);

  // skip first as it already called end_examples()
  auto it = alls.begin();
  for (it++; it != alls.end(); it++) (*it)->l->end_examples();
}